

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateCast(ExpressionEvalContext *ctx,ExprTypeCast *expression)

{
  ExpressionContext *pEVar1;
  _func_int **pp_Var2;
  char *pcVar3;
  TypeBase *pTVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  longlong in_RAX;
  ExprMemoryLiteral *memory;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TypeRef *pTVar8;
  ExprMemoryLiteral *el1;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  uchar *puVar9;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  ExprPointerLiteral *this;
  undefined4 extraout_var_16;
  ExprBase *pEVar10;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  ExprMemoryLiteral *pEVar11;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  TypeBase **ppTVar12;
  SynBase *pSVar13;
  undefined **ppuVar14;
  TypeBase *pTVar15;
  ExprPointerLiteral *pEVar16;
  Allocator *pAVar17;
  ExprTypeLiteral *typeLiteral;
  undefined1 uVar18;
  longlong result;
  undefined4 extraout_var_13;
  
  result = in_RAX;
  bVar5 = AddInstruction(ctx);
  if (!bVar5) {
    return (ExprBase *)0x0;
  }
  memory = (ExprMemoryLiteral *)Evaluate(ctx,expression->value);
  if (memory == (ExprMemoryLiteral *)0x0) {
    return (ExprBase *)0x0;
  }
  switch(expression->category) {
  case EXPR_CAST_NUMERICAL:
    bVar5 = ExpressionContext::IsIntegerType(ctx->ctx,(expression->super_ExprBase).type);
    if (!bVar5) {
      bVar5 = ExpressionContext::IsFloatingPointType(ctx->ctx,(expression->super_ExprBase).type);
      if (bVar5) {
        result = 0;
        bVar5 = TryTakeDouble((ExprBase *)memory,(double *)&result);
        if (bVar5) {
          pTVar15 = (expression->super_ExprBase).type;
          pEVar1 = ctx->ctx;
          if (pTVar15 == pEVar1->typeFloat) {
            iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
            this = (ExprPointerLiteral *)CONCAT44(extraout_var_25,iVar7);
            ppTVar12 = &ctx->ctx->typeFloat;
            pEVar16 = (ExprPointerLiteral *)(double)(float)(double)result;
          }
          else {
            if (pTVar15 != pEVar1->typeDouble) goto switchD_0013372c_default;
            iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
            this = (ExprPointerLiteral *)CONCAT44(extraout_var_16,iVar7);
            ppTVar12 = &ctx->ctx->typeDouble;
            pEVar16 = (ExprPointerLiteral *)result;
          }
          pTVar15 = *ppTVar12;
          pSVar13 = (expression->super_ExprBase).source;
          (this->super_ExprBase).typeID = 7;
          (this->super_ExprBase).source = pSVar13;
          (this->super_ExprBase).type = pTVar15;
          (this->super_ExprBase).next = (ExprBase *)0x0;
          (this->super_ExprBase).listed = false;
          (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223528;
          this->ptr = (uchar *)pEVar16;
          break;
        }
      }
      goto switchD_0013372c_default;
    }
    result = 0;
    if ((memory->super_ExprBase).typeID == 7) {
      pTVar15 = (expression->super_ExprBase).type;
      pEVar1 = ctx->ctx;
      if (pTVar15 == pEVar1->typeBool) {
        iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x30);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_20,iVar7);
        pSVar13 = (expression->super_ExprBase).source;
        pTVar15 = ctx->ctx->typeBool;
        pEVar16 = memory->ptr;
        (this->super_ExprBase).typeID = 3;
        (this->super_ExprBase).source = pSVar13;
        (this->super_ExprBase).type = pTVar15;
        (this->super_ExprBase).next = (ExprBase *)0x0;
        (this->super_ExprBase).listed = false;
        (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223480;
        (this->super_ExprBase).field_0x29 = (double)pEVar16 != 0.0;
        break;
      }
      if (pTVar15 == pEVar1->typeChar) {
        iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x30);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_24,iVar7);
        pSVar13 = (expression->super_ExprBase).source;
        pEVar16 = memory->ptr;
        pTVar15 = ctx->ctx->typeChar;
        (this->super_ExprBase).typeID = 4;
        (this->super_ExprBase).source = pSVar13;
        (this->super_ExprBase).type = pTVar15;
        (this->super_ExprBase).next = (ExprBase *)0x0;
        (this->super_ExprBase).listed = false;
        (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234b8;
        (this->super_ExprBase).field_0x29 = (char)(int)(double)pEVar16;
        break;
      }
      if (pTVar15 == pEVar1->typeShort) {
        iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_27,iVar7);
        pSVar13 = (expression->super_ExprBase).source;
        pTVar15 = ctx->ctx->typeShort;
        pEVar16 = (ExprPointerLiteral *)(long)(short)(int)(double)memory->ptr;
      }
      else {
        if (pTVar15 != pEVar1->typeInt) {
          if (pTVar15 != pEVar1->typeLong) goto switchD_0013372c_default;
          iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
          this = (ExprPointerLiteral *)CONCAT44(extraout_var,iVar7);
          pSVar13 = (expression->super_ExprBase).source;
          pEVar16 = memory->ptr;
          pTVar15 = ctx->ctx->typeLong;
          (this->super_ExprBase).typeID = 6;
          (this->super_ExprBase).source = pSVar13;
          (this->super_ExprBase).type = pTVar15;
          (this->super_ExprBase).next = (ExprBase *)0x0;
          (this->super_ExprBase).listed = false;
          (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234f0;
          this->ptr = (uchar *)(long)(double)pEVar16;
          break;
        }
        iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_29,iVar7);
        pSVar13 = (expression->super_ExprBase).source;
        pTVar15 = ctx->ctx->typeInt;
        pEVar16 = (ExprPointerLiteral *)(long)(int)(double)memory->ptr;
      }
    }
    else {
      bVar5 = TryTakeLong((ExprBase *)memory,&result);
      if (!bVar5) goto switchD_0013372c_default;
      pTVar15 = (expression->super_ExprBase).type;
      pEVar1 = ctx->ctx;
      if (pTVar15 == pEVar1->typeBool) {
        iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x30);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_26,iVar7);
        pSVar13 = (expression->super_ExprBase).source;
        pTVar15 = ctx->ctx->typeBool;
        pEVar16 = (ExprPointerLiteral *)result;
        goto LAB_00133a7a;
      }
      if (pTVar15 == pEVar1->typeChar) {
        iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x30);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_28,iVar7);
        pSVar13 = (expression->super_ExprBase).source;
        pTVar15 = ctx->ctx->typeChar;
        (this->super_ExprBase).typeID = 4;
        (this->super_ExprBase).source = pSVar13;
        (this->super_ExprBase).type = pTVar15;
        (this->super_ExprBase).next = (ExprBase *)0x0;
        (this->super_ExprBase).listed = false;
        ppuVar14 = &PTR__ExprBase_002234b8;
        uVar18 = (undefined1)result;
        goto LAB_00133fe0;
      }
      if (pTVar15 == pEVar1->typeShort) {
        iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_30,iVar7);
        pSVar13 = (expression->super_ExprBase).source;
        pTVar15 = ctx->ctx->typeShort;
        pEVar16 = (ExprPointerLiteral *)(long)(short)result;
      }
      else if (pTVar15 == pEVar1->typeInt) {
        iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_31,iVar7);
        pSVar13 = (expression->super_ExprBase).source;
        pTVar15 = ctx->ctx->typeInt;
        pEVar16 = (ExprPointerLiteral *)(long)(int)result;
      }
      else {
        if (pTVar15 != pEVar1->typeLong) goto switchD_0013372c_default;
        iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_17,iVar7);
        pSVar13 = (expression->super_ExprBase).source;
        pTVar15 = ctx->ctx->typeLong;
        pEVar16 = (ExprPointerLiteral *)result;
      }
    }
    (this->super_ExprBase).typeID = 6;
    (this->super_ExprBase).source = pSVar13;
    (this->super_ExprBase).type = pTVar15;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).listed = false;
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234f0;
    this->ptr = (uchar *)pEVar16;
    break;
  case EXPR_CAST_PTR_TO_BOOL:
    pAVar17 = ctx->ctx->allocator;
    iVar7 = (*pAVar17->_vptr_Allocator[2])(pAVar17,0x30);
    this = (ExprPointerLiteral *)CONCAT44(extraout_var_08,iVar7);
    pSVar13 = (expression->super_ExprBase).source;
    pTVar15 = ctx->ctx->typeBool;
    uVar6 = (memory->super_ExprBase).typeID;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).typeID = 3;
    (this->super_ExprBase).source = pSVar13;
    (this->super_ExprBase).type = pTVar15;
    (this->super_ExprBase).listed = false;
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223480;
    (this->super_ExprBase).field_0x29 = uVar6 != 9;
    break;
  case EXPR_CAST_UNSIZED_TO_BOOL:
    if ((memory->super_ExprBase).typeID != 0xd) {
      memory = (ExprMemoryLiteral *)0x0;
    }
    pTVar8 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
    pEVar10 = CreateExtract(ctx,memory,0,&pTVar8->super_TypeBase);
    pAVar17 = ctx->ctx->allocator;
    iVar7 = (*pAVar17->_vptr_Allocator[2])(pAVar17,0x30);
    this = (ExprPointerLiteral *)CONCAT44(extraout_var_03,iVar7);
    pSVar13 = (expression->super_ExprBase).source;
    pTVar15 = ctx->ctx->typeBool;
    if (pEVar10 == (ExprBase *)0x0) {
      uVar18 = true;
    }
    else {
      uVar18 = pEVar10->typeID != 9;
    }
    (this->super_ExprBase).typeID = 3;
    (this->super_ExprBase).source = pSVar13;
    (this->super_ExprBase).type = pTVar15;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).listed = false;
    ppuVar14 = &PTR__ExprBase_00223480;
LAB_00133fe0:
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)ppuVar14;
    (this->super_ExprBase).field_0x29 = uVar18;
    break;
  case EXPR_CAST_FUNCTION_TO_BOOL:
    pEVar11 = (ExprMemoryLiteral *)0x0;
    if ((memory->super_ExprBase).typeID == 0xb) {
      pEVar11 = memory;
    }
    pAVar17 = ctx->ctx->allocator;
    iVar7 = (*pAVar17->_vptr_Allocator[2])(pAVar17,0x30);
    this = (ExprPointerLiteral *)CONCAT44(extraout_var_04,iVar7);
    pSVar13 = (expression->super_ExprBase).source;
    pTVar15 = ctx->ctx->typeBool;
    pEVar16 = pEVar11->ptr;
LAB_00133a7a:
    (this->super_ExprBase).typeID = 3;
    (this->super_ExprBase).source = pSVar13;
    (this->super_ExprBase).type = pTVar15;
    (this->super_ExprBase).listed = false;
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223480;
    (this->super_ExprBase).field_0x29 = pEVar16 != (ExprPointerLiteral *)0x0;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    break;
  case EXPR_CAST_NULL_TO_PTR:
    pAVar17 = ctx->ctx->allocator;
LAB_00133856:
    iVar7 = (*pAVar17->_vptr_Allocator[2])(pAVar17,0x30);
    this = (ExprPointerLiteral *)CONCAT44(extraout_var_00,iVar7);
    (this->super_ExprBase).typeID = 9;
    pTVar15 = (expression->super_ExprBase).type;
    (this->super_ExprBase).source = (expression->super_ExprBase).source;
    (this->super_ExprBase).type = pTVar15;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).listed = false;
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002235d0;
    break;
  case EXPR_CAST_NULL_TO_AUTO_PTR:
    pAVar17 = ctx->ctx->allocator;
    iVar7 = (*pAVar17->_vptr_Allocator[2])(pAVar17,0x38);
    memory = (ExprMemoryLiteral *)CONCAT44(extraout_var_09,iVar7);
    pSVar13 = (expression->super_ExprBase).source;
    pEVar1 = ctx->ctx;
    pTVar15 = pEVar1->typeVoid;
    pTVar4 = pEVar1->typeTypeID;
    (memory->super_ExprBase).typeID = 8;
    (memory->super_ExprBase).source = pSVar13;
    (memory->super_ExprBase).type = pTVar4;
    (memory->super_ExprBase).next = (ExprBase *)0x0;
    (memory->super_ExprBase).listed = false;
    (memory->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223560;
    memory->ptr = (ExprPointerLiteral *)pTVar15;
    iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x30);
    el1 = (ExprMemoryLiteral *)CONCAT44(extraout_var_10,iVar7);
    pSVar13 = (expression->super_ExprBase).source;
    pTVar8 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
    (el1->super_ExprBase).typeID = 9;
    (el1->super_ExprBase).source = pSVar13;
    (el1->super_ExprBase).type = &pTVar8->super_TypeBase;
    (el1->super_ExprBase).next = (ExprBase *)0x0;
    (el1->super_ExprBase).listed = false;
    (el1->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002235d0;
    pTVar15 = (expression->super_ExprBase).type;
    goto LAB_00133f3a;
  case EXPR_CAST_NULL_TO_UNSIZED:
    pAVar17 = ctx->ctx->allocator;
    iVar7 = (*pAVar17->_vptr_Allocator[2])(pAVar17,0x30);
    memory = (ExprMemoryLiteral *)CONCAT44(extraout_var_11,iVar7);
    pSVar13 = (expression->super_ExprBase).source;
    pTVar8 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
    (memory->super_ExprBase).typeID = 9;
    (memory->super_ExprBase).source = pSVar13;
    (memory->super_ExprBase).type = &pTVar8->super_TypeBase;
    (memory->super_ExprBase).next = (ExprBase *)0x0;
    (memory->super_ExprBase).listed = false;
    (memory->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002235d0;
    pAVar17 = ctx->ctx->allocator;
    iVar7 = (*pAVar17->_vptr_Allocator[2])(pAVar17,0x38);
    el1 = (ExprMemoryLiteral *)CONCAT44(extraout_var_12,iVar7);
    pSVar13 = (expression->super_ExprBase).source;
    pTVar15 = ctx->ctx->typeInt;
    (el1->super_ExprBase).typeID = 6;
    (el1->super_ExprBase).source = pSVar13;
    (el1->super_ExprBase).type = pTVar15;
    (el1->super_ExprBase).next = (ExprBase *)0x0;
    (el1->super_ExprBase).listed = false;
    (el1->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234f0;
    el1->ptr = (ExprPointerLiteral *)0x0;
    pTVar15 = (expression->super_ExprBase).type;
    goto LAB_00133f3a;
  case EXPR_CAST_NULL_TO_AUTO_ARRAY:
    pAVar17 = ctx->ctx->allocator;
    iVar7 = (*pAVar17->_vptr_Allocator[2])(pAVar17,0x38);
    memory = (ExprMemoryLiteral *)CONCAT44(extraout_var_05,iVar7);
    pSVar13 = (expression->super_ExprBase).source;
    pEVar1 = ctx->ctx;
    pTVar15 = pEVar1->typeVoid;
    pTVar4 = pEVar1->typeTypeID;
    (memory->super_ExprBase).typeID = 8;
    (memory->super_ExprBase).source = pSVar13;
    (memory->super_ExprBase).type = pTVar4;
    (memory->super_ExprBase).next = (ExprBase *)0x0;
    (memory->super_ExprBase).listed = false;
    (memory->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223560;
    memory->ptr = (ExprPointerLiteral *)pTVar15;
    iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x30);
    el1 = (ExprMemoryLiteral *)CONCAT44(extraout_var_06,iVar7);
    pSVar13 = (expression->super_ExprBase).source;
    pTVar8 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
    (el1->super_ExprBase).typeID = 9;
    (el1->super_ExprBase).source = pSVar13;
    (el1->super_ExprBase).type = &pTVar8->super_TypeBase;
    (el1->super_ExprBase).next = (ExprBase *)0x0;
    (el1->super_ExprBase).listed = false;
    (el1->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002235d0;
    pAVar17 = ctx->ctx->allocator;
    iVar7 = (*pAVar17->_vptr_Allocator[2])(pAVar17,0x38);
    pEVar10 = (ExprBase *)CONCAT44(extraout_var_07,iVar7);
    pSVar13 = (expression->super_ExprBase).source;
    pTVar15 = ctx->ctx->typeInt;
    pEVar10->typeID = 6;
    pEVar10->source = pSVar13;
    pEVar10->type = pTVar15;
    pEVar10->next = (ExprBase *)0x0;
    pEVar10->listed = false;
    pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234f0;
    pEVar10[1]._vptr_ExprBase = (_func_int **)0x0;
    pTVar15 = (expression->super_ExprBase).type;
    goto LAB_00133f3d;
  case EXPR_CAST_NULL_TO_FUNCTION:
    pAVar17 = ctx->ctx->allocator;
    iVar7 = (*pAVar17->_vptr_Allocator[2])(pAVar17,0x30);
    puVar9 = (uchar *)CONCAT44(extraout_var_13,iVar7);
    pSVar13 = (expression->super_ExprBase).source;
    pTVar8 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
    puVar9[8] = '\t';
    puVar9[9] = '\0';
    puVar9[10] = '\0';
    puVar9[0xb] = '\0';
    *(SynBase **)(puVar9 + 0x10) = pSVar13;
    *(TypeRef **)(puVar9 + 0x18) = pTVar8;
    puVar9[0x20] = '\0';
    puVar9[0x21] = '\0';
    puVar9[0x22] = '\0';
    puVar9[0x23] = '\0';
    puVar9[0x24] = '\0';
    puVar9[0x25] = '\0';
    puVar9[0x26] = '\0';
    puVar9[0x27] = '\0';
    puVar9[0x28] = '\0';
    *(undefined ***)puVar9 = &PTR__ExprBase_002235d0;
    pAVar17 = ctx->ctx->allocator;
    iVar7 = (*pAVar17->_vptr_Allocator[2])(pAVar17,0x40);
    this = (ExprPointerLiteral *)CONCAT44(extraout_var_14,iVar7);
    (this->super_ExprBase).typeID = 0xb;
    pTVar15 = (expression->super_ExprBase).type;
    (this->super_ExprBase).source = (expression->super_ExprBase).source;
    (this->super_ExprBase).type = pTVar15;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).listed = false;
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223608;
    this->ptr = (uchar *)0x0;
    this->end = puVar9;
    break;
  case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
    pTVar15 = (memory->super_ExprBase).type;
    if ((pTVar15 == (TypeBase *)0x0) || (pTVar15->typeID != 0x12)) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4b9,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pp_Var2 = pTVar15[1]._vptr_TypeBase;
    if ((pp_Var2 == (_func_int **)0x0) || (*(int *)(pp_Var2 + 1) != 0x13)) {
      __assert_fail("arrType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4bd,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    if (*(int *)((long)pp_Var2 + 0x6c) != 0) {
      __assert_fail("unsigned(arrType->length) == arrType->length",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4be,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pTVar15 = (expression->super_ExprBase).type;
    pAVar17 = ctx->ctx->allocator;
    iVar7 = (*pAVar17->_vptr_Allocator[2])(pAVar17,0x38);
    el1 = (ExprMemoryLiteral *)CONCAT44(extraout_var_02,iVar7);
    pSVar13 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeInt;
    pEVar16 = (ExprPointerLiteral *)pp_Var2[0xd];
    (el1->super_ExprBase).typeID = 6;
    (el1->super_ExprBase).source = pSVar13;
    (el1->super_ExprBase).type = pTVar4;
    (el1->super_ExprBase).next = (ExprBase *)0x0;
    (el1->super_ExprBase).listed = false;
    (el1->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234f0;
    el1->ptr = pEVar16;
    goto LAB_00133f3a;
  case EXPR_CAST_PTR_TO_AUTO_PTR:
    pTVar15 = (memory->super_ExprBase).type;
    if ((pTVar15 == (TypeBase *)0x0) || (pTVar15->typeID != 0x12)) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4cc,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pp_Var2 = pTVar15[1]._vptr_TypeBase;
    if (((pp_Var2 == (_func_int **)0x0) || (*(int *)(pp_Var2 + 1) != 0x18)) ||
       ((*(char *)(pp_Var2 + 0x22) == '\0' && (pp_Var2[0x23] == (_func_int *)0x0)))) {
      pAVar17 = ctx->ctx->allocator;
      iVar7 = (*pAVar17->_vptr_Allocator[2])(pAVar17,0x38);
      pEVar11 = (ExprMemoryLiteral *)CONCAT44(extraout_var_15,iVar7);
      pSVar13 = (expression->super_ExprBase).source;
      pTVar4 = ctx->ctx->typeTypeID;
      pEVar16 = (ExprPointerLiteral *)pTVar15[1]._vptr_TypeBase;
      (pEVar11->super_ExprBase).typeID = 8;
      (pEVar11->super_ExprBase).source = pSVar13;
      (pEVar11->super_ExprBase).type = pTVar4;
      (pEVar11->super_ExprBase).next = (ExprBase *)0x0;
      (pEVar11->super_ExprBase).listed = false;
      (pEVar11->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223560;
      pEVar11->ptr = pEVar16;
    }
    else {
      uVar6 = (memory->super_ExprBase).typeID;
      if (uVar6 != 0xc) {
        if (uVar6 == 9) {
          Report(ctx,"ERROR: null pointer access");
          return (ExprBase *)0x0;
        }
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x4d9,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
      }
      if ((long)memory[1].super_ExprBase._vptr_ExprBase - (long)memory->ptr < 4) {
        __assert_fail("ptr->end - ptr->ptr >= 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x4da,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
      }
      pAVar17 = ctx->ctx->allocator;
      iVar7 = (*pAVar17->_vptr_Allocator[2])(pAVar17,0x40);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_19,iVar7);
      pSVar13 = (expression->super_ExprBase).source;
      pTVar8 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeTypeID);
      pEVar16 = memory->ptr;
      pEVar10->typeID = 0xc;
      pEVar10->source = pSVar13;
      pEVar10->type = &pTVar8->super_TypeBase;
      pEVar10->next = (ExprBase *)0x0;
      pEVar10->listed = false;
      pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223438;
      pEVar10[1]._vptr_ExprBase = (_func_int **)pEVar16;
      *(undefined1 **)&pEVar10[1].typeID =
           (undefined1 *)((long)&(pEVar16->super_ExprBase)._vptr_ExprBase + 4);
      pEVar11 = (ExprMemoryLiteral *)CreateLoad(ctx,pEVar10);
    }
    pTVar15 = (expression->super_ExprBase).type;
    el1 = memory;
    memory = pEVar11;
LAB_00133f3a:
    pEVar10 = (ExprBase *)0x0;
LAB_00133f3d:
    this = (ExprPointerLiteral *)
           CreateConstruct(ctx,pTVar15,&memory->super_ExprBase,&el1->super_ExprBase,pEVar10);
LAB_00133f42:
    if (this == (ExprPointerLiteral *)0x0) {
      return (ExprBase *)0x0;
    }
    break;
  case EXPR_CAST_AUTO_PTR_TO_PTR:
    pTVar15 = (expression->super_ExprBase).type;
    if ((pTVar15 == (TypeBase *)0x0) || (pTVar15->typeID != 0x12)) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4ef,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pEVar11 = memory;
    if ((memory->super_ExprBase).typeID != 0xd) {
      pEVar11 = (ExprMemoryLiteral *)0x0;
    }
    pEVar10 = CreateExtract(ctx,pEVar11,0,ctx->ctx->typeTypeID);
    if (pEVar10[1]._vptr_ExprBase != pTVar15[1]._vptr_TypeBase) goto switchD_0013372c_default;
    this = (ExprPointerLiteral *)CreateExtract(ctx,pEVar11,4,pTVar15);
    goto LAB_00133f42;
  case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
    pTVar15 = (memory->super_ExprBase).type;
    if ((pTVar15 == (TypeBase *)0x0) || (pTVar15->typeID != 0x14)) {
      __assert_fail("arrType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x504,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pEVar11 = memory;
    if ((memory->super_ExprBase).typeID != 0xd) {
      pEVar11 = (ExprMemoryLiteral *)0x0;
    }
    pAVar17 = ctx->ctx->allocator;
    iVar7 = (*pAVar17->_vptr_Allocator[2])(pAVar17,0x38);
    memory = (ExprMemoryLiteral *)CONCAT44(extraout_var_01,iVar7);
    pSVar13 = (expression->super_ExprBase).source;
    pEVar1 = ctx->ctx;
    pTVar4 = pEVar1->typeTypeID;
    pEVar16 = *(ExprPointerLiteral **)&pTVar15[1].typeIndex;
    (memory->super_ExprBase).typeID = 8;
    (memory->super_ExprBase).source = pSVar13;
    (memory->super_ExprBase).type = pTVar4;
    (memory->super_ExprBase).next = (ExprBase *)0x0;
    (memory->super_ExprBase).listed = false;
    (memory->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223560;
    memory->ptr = pEVar16;
    pTVar8 = ExpressionContext::GetReferenceType(pEVar1,pEVar1->typeVoid);
    el1 = (ExprMemoryLiteral *)CreateExtract(ctx,pEVar11,0,&pTVar8->super_TypeBase);
    pEVar10 = CreateExtract(ctx,pEVar11,8,ctx->ctx->typeInt);
    pTVar15 = (expression->super_ExprBase).type;
    goto LAB_00133f3d;
  case EXPR_CAST_REINTERPRET:
    pTVar15 = (expression->super_ExprBase).type;
    pEVar1 = ctx->ctx;
    if ((pTVar15 == pEVar1->typeInt) && ((memory->super_ExprBase).type == pEVar1->typeTypeID)) {
      pTVar15 = (TypeBase *)memory->ptr;
      if ((pTVar15 != (TypeBase *)0x0) &&
         ((pTVar15->typeID < 0x1d && ((0x18000001U >> (pTVar15->typeID & 0x1f) & 1) != 0)))) {
        return (ExprBase *)0x0;
      }
      uVar6 = ExpressionContext::GetTypeIndex(pEVar1,pTVar15);
      pAVar17 = ctx->ctx->allocator;
      iVar7 = (*pAVar17->_vptr_Allocator[2])(pAVar17,0x38);
      this = (ExprPointerLiteral *)CONCAT44(extraout_var_18,iVar7);
      pSVar13 = (expression->super_ExprBase).source;
      pTVar15 = ctx->ctx->typeInt;
      (this->super_ExprBase).typeID = 6;
      (this->super_ExprBase).source = pSVar13;
      (this->super_ExprBase).type = pTVar15;
      (this->super_ExprBase).next = (ExprBase *)0x0;
      pEVar16 = (ExprPointerLiteral *)(ulong)uVar6;
    }
    else {
      if (pTVar15 == (TypeBase *)0x0) goto switchD_0013372c_default;
      switch(pTVar15->typeID) {
      case 0x12:
        pTVar4 = (memory->super_ExprBase).type;
        if ((pTVar4 == (TypeBase *)0x0) || (pTVar4->typeID != 0x12)) goto switchD_0013372c_default;
        uVar6 = (memory->super_ExprBase).typeID;
        if (uVar6 == 0xc) {
          if ((_func_int *)((long)memory[1].super_ExprBase._vptr_ExprBase - (long)memory->ptr) <
              pTVar15[1]._vptr_TypeBase[6]) {
            __assert_fail("uintptr_t(tmp->end - tmp->ptr) >= uintptr_t(refType->subType->size)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                          ,0x52d,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
          }
          iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x40);
          this = (ExprPointerLiteral *)CONCAT44(extraout_var_32,iVar7);
          ExprPointerLiteral::ExprPointerLiteral
                    (this,(expression->super_ExprBase).source,(expression->super_ExprBase).type,
                     (uchar *)memory->ptr,(uchar *)memory[1].super_ExprBase._vptr_ExprBase);
          goto LAB_00133fed;
        }
        if (uVar6 != 9) goto switchD_0013372c_default;
        pAVar17 = pEVar1->allocator;
        goto LAB_00133856;
      case 0x14:
        pTVar15 = (memory->super_ExprBase).type;
        if ((pTVar15 == (TypeBase *)0x0) || (pTVar15->typeID != 0x14))
        goto switchD_0013372c_default;
        pEVar11 = (ExprMemoryLiteral *)0x0;
        if ((memory->super_ExprBase).typeID == 0xd) {
          pEVar11 = memory;
        }
        iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_23,iVar7);
        pEVar16 = pEVar11->ptr;
        (this->super_ExprBase).typeID = 0xd;
        pTVar15 = (expression->super_ExprBase).type;
        (this->super_ExprBase).source = (expression->super_ExprBase).source;
        (this->super_ExprBase).type = pTVar15;
        (this->super_ExprBase).next = (ExprBase *)0x0;
        (this->super_ExprBase).listed = false;
        ppuVar14 = &PTR__ExprBase_00223640;
        goto LAB_001342ab;
      case 0x15:
        pTVar15 = (memory->super_ExprBase).type;
        if ((pTVar15 != (TypeBase *)0x0) && (pTVar15->typeID == 0x15)) {
          pEVar11 = (ExprMemoryLiteral *)0x0;
          if ((memory->super_ExprBase).typeID == 0xb) {
            pEVar11 = memory;
          }
          iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x40);
          this = (ExprPointerLiteral *)CONCAT44(extraout_var_21,iVar7);
          (this->super_ExprBase).typeID = 0xb;
          pSVar13 = (expression->super_ExprBase).source;
          pTVar15 = (expression->super_ExprBase).type;
          (this->super_ExprBase).next = (ExprBase *)0x0;
          (this->super_ExprBase).listed = false;
          (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223608;
          pEVar16 = pEVar11->ptr;
          pp_Var2 = pEVar11[1].super_ExprBase._vptr_ExprBase;
          (this->super_ExprBase).source = pSVar13;
          (this->super_ExprBase).type = pTVar15;
          this->ptr = (uchar *)pEVar16;
          this->end = (uchar *)pp_Var2;
          goto LAB_00133fed;
        }
      case 0x13:
      case 0x16:
      case 0x17:
      case 0x18:
switchD_0013372c_default:
        pTVar15 = (memory->super_ExprBase).type;
        pcVar3 = (pTVar15->name).begin;
        pTVar4 = (expression->super_ExprBase).type;
        Report(ctx,"ERROR: failed to cast \'%.*s\' to \'%.*s\'",
               (ulong)(uint)(*(int *)&(pTVar15->name).end - (int)pcVar3),pcVar3,
               (ulong)(uint)(*(int *)&(pTVar4->name).end - (int)(pTVar4->name).begin));
        return (ExprBase *)0x0;
      case 0x19:
        pTVar15 = (memory->super_ExprBase).type;
        if ((pTVar15 == (TypeBase *)0x0) || (pTVar15->typeID != 5)) goto switchD_0013372c_default;
        break;
      default:
        if (((pTVar15->typeID != 5) ||
            (pTVar15 = (memory->super_ExprBase).type, pTVar15 == (TypeBase *)0x0)) ||
           (pTVar15->typeID != 0x19)) goto switchD_0013372c_default;
      }
      pEVar11 = (ExprMemoryLiteral *)0x0;
      if ((memory->super_ExprBase).typeID == 6) {
        pEVar11 = memory;
      }
      iVar7 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
      this = (ExprPointerLiteral *)CONCAT44(extraout_var_22,iVar7);
      pEVar16 = pEVar11->ptr;
      (this->super_ExprBase).typeID = 6;
      pTVar15 = (expression->super_ExprBase).type;
      (this->super_ExprBase).source = (expression->super_ExprBase).source;
      (this->super_ExprBase).type = pTVar15;
      (this->super_ExprBase).next = (ExprBase *)0x0;
    }
    (this->super_ExprBase).listed = false;
    ppuVar14 = &PTR__ExprBase_002234f0;
LAB_001342ab:
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)ppuVar14;
    this->ptr = (uchar *)pEVar16;
    break;
  default:
    goto switchD_0013372c_default;
  }
LAB_00133fed:
  pEVar10 = CheckType(&expression->super_ExprBase,&this->super_ExprBase);
  return pEVar10;
}

Assistant:

ExprBase* EvaluateCast(ExpressionEvalContext &ctx, ExprTypeCast *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	switch(expression->category)
	{
	case EXPR_CAST_NUMERICAL:
		if(ctx.ctx.IsIntegerType(expression->type))
		{
			long long result = 0;

			if(ExprRationalLiteral *expr = getType<ExprRationalLiteral>(value))
			{
				if(expression->type == ctx.ctx.typeBool)
					return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, expr->value != 0.0));

				if(expression->type == ctx.ctx.typeChar)
					return CheckType(expression, new (ctx.ctx.get<ExprCharacterLiteral>()) ExprCharacterLiteral(expression->source, ctx.ctx.typeChar, (char)expr->value));

				if(expression->type == ctx.ctx.typeShort)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeShort, (short)expr->value));

				if(expression->type == ctx.ctx.typeInt)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, (int)expr->value));

				if(expression->type == ctx.ctx.typeLong)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeLong, (long long)expr->value));
			}
			else if(TryTakeLong(value, result))
			{
				if(expression->type == ctx.ctx.typeBool)
					return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, result != 0));

				if(expression->type == ctx.ctx.typeChar)
					return CheckType(expression, new (ctx.ctx.get<ExprCharacterLiteral>()) ExprCharacterLiteral(expression->source, ctx.ctx.typeChar, (char)result));

				if(expression->type == ctx.ctx.typeShort)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeShort, (short)result));

				if(expression->type == ctx.ctx.typeInt)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, (int)result));

				if(expression->type == ctx.ctx.typeLong)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeLong, result));
			}
		}
		else if(ctx.ctx.IsFloatingPointType(expression->type))
		{
			double result = 0.0;

			if(TryTakeDouble(value, result))
			{
				if(expression->type == ctx.ctx.typeFloat)
					return CheckType(expression, new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(expression->source, ctx.ctx.typeFloat, (float)result));

				if(expression->type == ctx.ctx.typeDouble)
					return CheckType(expression, new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(expression->source, ctx.ctx.typeDouble, result));
			}
		}
		break;
	case EXPR_CAST_PTR_TO_BOOL:
		return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, !isType<ExprNullptrLiteral>(value)));
	case EXPR_CAST_UNSIZED_TO_BOOL:
		{
			ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

			ExprBase *ptr = CreateExtract(ctx, memLiteral, 0, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));

			return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, !isType<ExprNullptrLiteral>(ptr)));
		}
		break;
	case EXPR_CAST_FUNCTION_TO_BOOL:
		{
			ExprFunctionLiteral *funcLiteral = getType<ExprFunctionLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, funcLiteral->data != NULL));
		}
		break;
	case EXPR_CAST_NULL_TO_PTR:
		return CheckType(expression, new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, expression->type));
	case EXPR_CAST_NULL_TO_AUTO_PTR:
		{
			ExprBase *typeId = new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, ctx.ctx.typeTypeID, ctx.ctx.typeVoid);
			ExprBase *ptr = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));

			ExprBase *result = CreateConstruct(ctx, expression->type, typeId, ptr, NULL);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_NULL_TO_UNSIZED:
		{
			ExprBase *ptr = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));
			ExprBase *size = new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, 0);

			ExprBase *result = CreateConstruct(ctx, expression->type, ptr, size, NULL);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_NULL_TO_AUTO_ARRAY:
		{
			ExprBase *typeId = new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, ctx.ctx.typeTypeID, ctx.ctx.typeVoid);
			ExprBase *ptr = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));
			ExprBase *length = new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, 0);

			ExprBase *result = CreateConstruct(ctx, expression->type, typeId, ptr, length);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_NULL_TO_FUNCTION:
		{
			ExprBase *context = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));

			ExprFunctionLiteral *result = new (ctx.ctx.get<ExprFunctionLiteral>()) ExprFunctionLiteral(expression->source, expression->type, NULL, context);

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
		{
			TypeRef *refType = getType<TypeRef>(value->type);

			assert(refType);

			TypeArray *arrType = getType<TypeArray>(refType->subType);

			assert(arrType);
			assert(unsigned(arrType->length) == arrType->length);

			ExprBase *result = CreateConstruct(ctx, expression->type, value, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, arrType->length), NULL);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_PTR_TO_AUTO_PTR:
		{
			TypeRef *refType = getType<TypeRef>(value->type);

			assert(refType);

			TypeClass *classType = getType<TypeClass>(refType->subType);

			ExprBase *typeId = NULL;

			if(classType && (classType->extendable || classType->baseClass))
			{
				if(isType<ExprNullptrLiteral>(value))
					return Report(ctx, "ERROR: null pointer access");

				ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(value);

				assert(ptr);
				assert(ptr->end - ptr->ptr >= 4);

				typeId = CreateLoad(ctx, new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeTypeID), ptr->ptr, ptr->ptr + 4));
			}
			else
			{
				typeId = new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, ctx.ctx.typeTypeID, refType->subType);
			}

			ExprBase *result = CreateConstruct(ctx, expression->type, typeId, value, NULL);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_AUTO_PTR_TO_PTR:
		{
			TypeRef *refType = getType<TypeRef>(expression->type);

			assert(refType);

			ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

			ExprTypeLiteral *typeId = getType<ExprTypeLiteral>(CreateExtract(ctx, memLiteral, 0, ctx.ctx.typeTypeID));

			if(typeId->value != refType->subType)
				return Report(ctx, "ERROR: failed to cast '%.*s' to '%.*s'", FMT_ISTR(value->type->name), FMT_ISTR(expression->type->name));

			ExprBase *ptr = CreateExtract(ctx, memLiteral, 4, refType);

			if(!ptr)
				return NULL;

			return CheckType(expression, ptr);
		}
		break;
	case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
		{
			TypeUnsizedArray *arrType = getType<TypeUnsizedArray>(value->type);

			assert(arrType);

			ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

			ExprBase *typeId = new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, ctx.ctx.typeTypeID, arrType->subType);
			ExprBase *ptr = CreateExtract(ctx, memLiteral, 0, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));
			ExprBase *length = CreateExtract(ctx, memLiteral, sizeof(void*), ctx.ctx.typeInt);

			ExprBase *result = CreateConstruct(ctx, expression->type, typeId, ptr, length);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_REINTERPRET:
		if(expression->type == ctx.ctx.typeInt && value->type == ctx.ctx.typeTypeID)
		{
			ExprTypeLiteral *typeLiteral = getType<ExprTypeLiteral>(value);

			if(isType<TypeError>(typeLiteral->value))
				return NULL;

			if(isType<TypeArgumentSet>(typeLiteral->value) || isType<TypeMemberSet>(typeLiteral->value))
				return NULL;

			unsigned index = ctx.ctx.GetTypeIndex(typeLiteral->value);

			return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, index));
		}
		else if(isType<TypeRef>(expression->type) && isType<TypeRef>(value->type))
		{
			TypeRef *refType = getType<TypeRef>(expression->type);

			if(isType<ExprNullptrLiteral>(value))
				return CheckType(expression, new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, expression->type));
			
			if(ExprPointerLiteral *tmp = getType<ExprPointerLiteral>(value))
			{
				(void)refType;
				assert(uintptr_t(tmp->end - tmp->ptr) >= uintptr_t(refType->subType->size));

				return CheckType(expression, new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, expression->type, tmp->ptr, tmp->end));
			}
		}
		else if(isType<TypeUnsizedArray>(expression->type) && isType<TypeUnsizedArray>(value->type))
		{
			ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprMemoryLiteral>()) ExprMemoryLiteral(expression->source, expression->type, memLiteral->ptr));
		}
		else if(isType<TypeFunction>(expression->type) && isType<TypeFunction>(value->type))
		{
			ExprFunctionLiteral *funcLiteral = getType<ExprFunctionLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprFunctionLiteral>()) ExprFunctionLiteral(expression->source, expression->type, funcLiteral->data, funcLiteral->context));
		}
		else if(isType<TypeInt>(expression->type) && isType<TypeEnum>(value->type))
		{
			ExprIntegerLiteral *intLiteral = getType<ExprIntegerLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, intLiteral->value));
		}
		else if(isType<TypeEnum>(expression->type) && isType<TypeInt>(value->type))
		{
			ExprIntegerLiteral *intLiteral = getType<ExprIntegerLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, intLiteral->value));
		}
		break;
	}

	return Report(ctx, "ERROR: failed to cast '%.*s' to '%.*s'", FMT_ISTR(value->type->name), FMT_ISTR(expression->type->name));
}